

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O2

char * fl_find_fontsize(char *name)

{
  char *pcVar1;
  char *pcVar2;
  
  if (*name == '-') {
    pcVar1 = fl_font_word(name,7);
    if ((*pcVar1 == '\0') || (9 < (int)pcVar1[1] - 0x30U)) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = pcVar1 + 1;
    }
  }
  else {
    pcVar1 = (char *)0x0;
    while (pcVar2 = name, pcVar2[1] != '\0') {
      name = pcVar2 + 1;
      if (((int)pcVar2[1] - 0x30U < 10) && (9 < (int)*pcVar2 - 0x30U)) {
        pcVar1 = name;
      }
    }
  }
  return pcVar1;
}

Assistant:

char* fl_find_fontsize(char* name) {
  char* c = name;
  // for standard x font names, try after 7th dash:
  if (*c == '-') {
    c = (char*)fl_font_word(c,7);
    if (*c++ && isdigit(*c)) return c;
    return 0; // malformed x font name?
  }
  char* r = 0;
  // find last set of digits:
  for (c++;* c; c++)
    if (isdigit(*c) && !isdigit(*(c-1))) r = c;
  return r;
}